

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_WEB(effect_handler_context_t_conflict *context)

{
  wchar_t idx;
  int iVar1;
  bool bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  monster *pmVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  loc grid;
  
  idx = cave->mon_current;
  if (L'\0' < idx) {
    pmVar5 = cave_monster(cave,idx);
    context->ident = true;
    wVar6 = pmVar5->race->spell_power;
    wVar7 = (L'(' < wVar6) + 1 + (uint)(L'P' < wVar6);
    iVar1 = (pmVar5->grid).y;
    wVar8 = iVar1 - wVar7;
    if (wVar8 <= (uint)(L'(' < wVar6) + (uint)(L'P' < wVar6) + iVar1 + L'\x01') {
      do {
        iVar1 = (pmVar5->grid).x;
        wVar6 = iVar1 - wVar7;
        if (wVar6 <= iVar1 + wVar7) {
          do {
            grid.y = wVar8;
            grid.x = wVar6;
            wVar4 = distance((loc_conflict)grid,pmVar5->grid);
            if (((wVar4 <= wVar7) && (_Var3 = square_in_bounds_fully(cave,grid), _Var3)) &&
               (_Var3 = square_iswebbable(cave,grid), _Var3)) {
              square_add_web(cave,grid);
            }
            bVar2 = wVar6 < (pmVar5->grid).x + wVar7;
            wVar6 = wVar6 + L'\x01';
          } while (bVar2);
        }
        bVar2 = wVar8 < (pmVar5->grid).y + wVar7;
        wVar8 = wVar8 + L'\x01';
      } while (bVar2);
    }
  }
  return L'\0' < idx;
}

Assistant:

bool effect_handler_WEB(effect_handler_context_t *context)
{
	int rad = 1;
	struct monster *mon = NULL;
	struct loc grid;

	/* Get the monster creating */
	if (cave->mon_current > 0) {
		mon = cave_monster(cave, cave->mon_current);
	} else {
		/* Player can't currently create webs */
		return false;
	}

	/* Always notice */
	context->ident = true;

	/* Increase the radius for higher spell power */
	if (mon->race->spell_power > 40) rad++;
	if (mon->race->spell_power > 80) rad++;

	/* Check within the radius for clear floor */
	for (grid.y = mon->grid.y - rad; grid.y <= mon->grid.y + rad; grid.y++) {
		for (grid.x = mon->grid.x - rad; grid.x <= mon->grid.x + rad; grid.x++){
			if (distance(grid, mon->grid) > rad ||
				!square_in_bounds_fully(cave, grid)) continue;

			/* Require a floor grid with no existing traps or glyphs */
			if (!square_iswebbable(cave, grid)) continue;

			/* Create a web */
			square_add_web(cave, grid);
		}
	}

	return true;
}